

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

bool kratos::connected(shared_ptr<kratos::Port> *port,
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *bits)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht;
  element_type *peVar5;
  VarException *this;
  uint uVar6;
  __hashtable *__this;
  bool bVar7;
  long *plVar8;
  double dVar9;
  initializer_list<const_kratos::IRNode_*> __l;
  undefined1 local_d0 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sources;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_90;
  undefined1 local_78 [8];
  __alloc_node_gen_t __alloc_node_gen;
  undefined1 local_58 [8];
  shared_ptr<kratos::VarSlice> ptr;
  allocator_type local_31;
  undefined4 extraout_var_00;
  
  uVar3 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Var).super_IRNode._vptr_IRNode[7])();
  dVar9 = ceil((double)uVar3 / (double)(bits->_M_h)._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::rehash(&bits->_M_h,(long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9);
  iVar4 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Var).super_IRNode._vptr_IRNode[0x10])();
  if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x18) == 0) {
    bVar7 = false;
  }
  else {
    iVar4 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Var).super_IRNode._vptr_IRNode[0x10])();
    __ht = (_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)CONCAT44(extraout_var_00,iVar4);
    local_78 = (undefined1  [8])local_d0;
    local_d0 = (undefined1  [8])0x0;
    sources._M_h._M_buckets = (__buckets_ptr)__ht->_M_bucket_count;
    sources._M_h._M_bucket_count = 0;
    sources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)__ht->_M_element_count;
    sources._M_h._M_element_count = *(size_type *)&__ht->_M_rehash_policy;
    sources._M_h._M_rehash_policy._0_8_ = (__ht->_M_rehash_policy)._M_next_resize;
    sources._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<kratos::AssignStmt>,false>>>>
              ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_78,__ht,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<kratos::AssignStmt>,_false>_>_>
                *)local_78);
    if (sources._M_h._M_bucket_count == 0) {
      bVar7 = false;
    }
    else {
      bVar7 = false;
      plVar8 = (long *)sources._M_h._M_bucket_count;
      do {
        if (*(int *)(*(long *)(plVar8[1] + 0xc0) + 0x168) == 2) {
          Var::as<kratos::VarSlice>((Var *)local_58);
          peVar5 = (element_type *)(**(code **)(*(_func_int **)local_58 + 0x148))();
          if (peVar5 == (port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          {
            cVar2 = (**(code **)(*(_func_int **)local_58 + 0x158))();
            if (cVar2 == '\0') {
              ptr.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              ._4_4_ = (**(code **)(*(_func_int **)local_58 + 0x130))();
              uVar6 = (**(code **)(*(_func_int **)local_58 + 0x128))();
              uVar3 = ptr.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_;
            }
            else {
              iVar4 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_Var).super_IRNode._vptr_IRNode[7])();
              uVar6 = iVar4 - 1;
              uVar3 = 0;
            }
            while( true ) {
              local_78._0_4_ = uVar3;
              if (uVar6 < uVar3) break;
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::_M_emplace<unsigned_int&>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)bits,local_78);
              uVar3 = local_78._0_4_ + 1;
            }
            iVar4 = 0;
          }
          else {
            cVar2 = (**(code **)(*(_func_int **)local_58 + 0x158))();
            iVar4 = 3;
            if (cVar2 == '\0') {
              this = (VarException *)__cxa_allocate_exception(0x10);
              local_78 = (undefined1  [8])&stack0xffffffffffffff98;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_78,"Internal error. Variable has un-related sources","");
              sources._M_h._M_single_bucket =
                   (__node_base_ptr)
                   (port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              __l._M_len = 1;
              __l._M_array = (iterator)&sources._M_h._M_single_bucket;
              std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                        (&local_90,__l,&local_31);
              VarException::VarException(this,(string *)local_78,&local_90);
              __cxa_throw(this,&VarException::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          if (ptr.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ptr.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
        else {
          uVar3 = 0;
          while( true ) {
            local_78._0_4_ = uVar3;
            uVar6 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_Var).super_IRNode._vptr_IRNode[7])();
            if (uVar6 <= uVar3) break;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_int&>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)bits,local_78);
            uVar3 = local_78._0_4_ + 1;
          }
          bVar7 = true;
          iVar4 = 2;
        }
      } while (((iVar4 == 3) || (iVar4 == 0)) && (plVar8 = (long *)*plVar8, plVar8 != (long *)0x0));
    }
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_d0);
  }
  if ((bVar7) &&
     (uVar1 = (bits->_M_h)._M_element_count,
     uVar3 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_Var).super_IRNode._vptr_IRNode[7])(), uVar1 != uVar3)) {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool connected(const std::shared_ptr<Port>& port, std::unordered_set<uint32_t>& bits) {
    bool result = false;
    bits.reserve(port->width());
    if (!port->sources().empty()) {
        // it has been assigned. need to compute all the slices
        auto sources = port->sources();
        for (const auto& stmt : sources) {
            auto* src = stmt->left();
            if (src->type() == VarType::Slice) {
                auto ptr = src->as<VarSlice>();
                auto* ptr_parent = ptr->get_var_root_parent();
                uint32_t high, low;
                if (ptr_parent != port.get()) {
                    // it got be a sliced by var
                    if (!ptr->sliced_by_var())
                        throw VarException("Internal error. Variable has un-related sources",
                                           {port.get()});
                    // it's actually not driven by the current net
                    continue;
                } else {
                    if (ptr->sliced_by_var()) {
                        // possibly to hit all bits
                        low = 0;
                        high = port->width() - 1;
                    } else {
                        low = ptr->var_low();
                        high = ptr->var_high();
                    }
                }
                for (uint32_t i = low; i <= high; i++) {
                    bits.emplace(i);
                }
            } else {
                result = true;
                for (uint32_t i = 0; i < port->width(); i++) bits.emplace(i);
                break;
            }
        }
    }
    if (result && bits.size() != port->width()) result = false;
    return result;
}